

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O1

int __thiscall
Fl_Tree::item_pathname(Fl_Tree *this,char *pathname,int pathnamelen,Fl_Tree_Item *item)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  char *__s;
  int iVar7;
  
  *pathname = '\0';
  if (item == (Fl_Tree_Item *)0x0) {
    item = this->_root;
  }
  if (item == (Fl_Tree_Item *)0x0) {
    iVar7 = -1;
  }
  else {
    if (pathnamelen < 2) {
      *pathname = '\0';
    }
    else {
      pathname[(ulong)(uint)pathnamelen - 1] = '\0';
      pcVar6 = pathname + ((ulong)(uint)pathnamelen - 2);
      iVar7 = 1;
      do {
        if ((item == (Fl_Tree_Item *)0x0) ||
           ((item->_parent == (Fl_Tree_Item *)0x0 && ((this->_prefs)._showroot == '\0')))) {
          pcVar2 = pcVar6 + 2;
          if (pcVar6[1] != '/') {
            pcVar2 = pcVar6 + 1;
          }
          if (pcVar2 == pathname) {
            return 0;
          }
          memmove(pathname,pcVar2,(long)(int)(iVar7 - (uint)(pcVar6[1] == '/')));
          return 0;
        }
        pcVar2 = Fl_Tree_Item::label(item);
        __s = "???";
        if (pcVar2 != (char *)0x0) {
          __s = Fl_Tree_Item::label(item);
        }
        sVar3 = strlen(__s);
        if (0 < (int)(uint)sVar3) {
          lVar4 = (ulong)((uint)sVar3 & 0x7fffffff) + 1;
          pcVar2 = pcVar6;
          do {
            iVar5 = iVar7 + 1;
            if (pathnamelen <= iVar5) {
              *pathname = '\0';
              bVar1 = false;
              goto LAB_001d9a6b;
            }
            pcVar6 = pcVar2 + -1;
            *pcVar2 = __s[lVar4 + -2];
            if ((__s[lVar4 + -2] == '\\') || (__s[lVar4 + -2] == '/')) {
              iVar5 = iVar7 + 2;
              if (pathnamelen <= iVar5) {
                *pathname = '\0';
                bVar1 = false;
                pcVar2 = pcVar6;
                goto LAB_001d9a6b;
              }
              pcVar2[-1] = '\\';
              pcVar6 = pcVar2 + -2;
            }
            iVar7 = iVar5;
            lVar4 = lVar4 + -1;
            pcVar2 = pcVar6;
          } while (1 < lVar4);
        }
        iVar5 = iVar7 + 1;
        if (pathnamelen <= iVar5) {
          *pathname = '\0';
        }
        else {
          *pcVar6 = '/';
          pcVar6 = pcVar6 + -1;
          item = item->_parent;
        }
        bVar1 = pathnamelen > iVar5;
        pcVar2 = pcVar6;
LAB_001d9a6b:
        pcVar6 = pcVar2;
        iVar7 = iVar5;
      } while (bVar1);
    }
    iVar7 = -2;
  }
  return iVar7;
}

Assistant:

int Fl_Tree::item_pathname(char *pathname, int pathnamelen, const Fl_Tree_Item *item) const {
  pathname[0] = '\0';
  item = item ? item : _root;
  if ( !item ) return(-1);
  // Build pathname starting at end
  char *s = (pathname+pathnamelen-1);
  int slen = 0;			// length of string compiled so far (including NULL)
  SAFE_RCAT('\0');
  while ( item ) {
    if ( item->is_root() && showroot() == 0 ) break;		// don't include root in path if showroot() off
    // Find name of current item
    const char *name = item->label() ? item->label() : "???";	// name for this item
    int len = (int) strlen(name);
    // Add name to end of pathname[]
    for ( --len; len>=0; len-- ) {
      SAFE_RCAT(name[len]);					// rcat name of item
      if ( name[len] == '/' || name[len] == '\\' ) {
        SAFE_RCAT('\\');					// escape front or back slashes within name
      }
    }
    SAFE_RCAT('/');						// rcat leading slash
    item = item->parent();					// move up tree (NULL==root)
  }
  if ( *(++s) == '/' ) { ++s; --slen; }				// leave off leading slash from pathname
  if ( s != pathname ) memmove(pathname, s, slen);	// Shift down right-aligned string
  return(0);
}